

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndTabItem(void)

{
  ImGuiContext *pIVar1;
  ImGuiTabBar **ppIVar2;
  ImGuiTabItem *pIVar3;
  ImGuiTabItem *tab;
  ImGuiTabBar *tab_bar;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    ppIVar2 = ImVector<ImGuiTabBar_*>::back(&GImGui->CurrentTabBar);
    pIVar3 = ImVector<ImGuiTabItem>::operator[](&(*ppIVar2)->Tabs,(int)(*ppIVar2)->LastTabItemIdx);
    if ((pIVar3->Flags & 8U) == 0) {
      ImVector<unsigned_int>::pop_back(&pIVar1->CurrentWindow->IDStack);
    }
  }
  return;
}

Assistant:

void    ImGui::EndTabItem()
{
    ImGuiContext& g = *GImGui;
    if (g.CurrentWindow->SkipItems)
        return;

    IM_ASSERT(g.CurrentTabBar.Size > 0 && "Needs to be called between BeginTabBar() and EndTabBar()!");
    ImGuiTabBar* tab_bar = g.CurrentTabBar.back();
    IM_ASSERT(tab_bar->LastTabItemIdx >= 0 && "Needs to be called between BeginTabItem() and EndTabItem()");
    ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
    if (!(tab->Flags & ImGuiTabItemFlags_NoPushId))
        g.CurrentWindow->IDStack.pop_back();
}